

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O0

size_t al_fwrite16be(ALLEGRO_FILE *f,int16_t w)

{
  byte bVar1;
  uint uVar2;
  undefined2 in_SI;
  uint8_t b2;
  uint8_t b1;
  undefined4 in_stack_ffffffffffffffe8;
  byte bVar3;
  undefined8 local_8;
  
  bVar3 = (byte)((ushort)in_SI >> 8);
  bVar1 = (byte)in_SI;
  uVar2 = al_fputc((ALLEGRO_FILE *)
                   CONCAT26(in_SI,CONCAT15(bVar3,CONCAT14(bVar1,in_stack_ffffffffffffffe8))),0);
  if (uVar2 == bVar3) {
    uVar2 = al_fputc((ALLEGRO_FILE *)
                     CONCAT26(in_SI,CONCAT15(bVar3,CONCAT14(bVar1,in_stack_ffffffffffffffe8))),0);
    if (uVar2 == bVar1) {
      local_8 = 2;
    }
    else {
      local_8 = 1;
    }
  }
  else {
    local_8 = 0;
  }
  return local_8;
}

Assistant:

size_t al_fwrite16be(ALLEGRO_FILE *f, int16_t w)
{
   uint8_t b1, b2;
   ASSERT(f);

   b1 = (w & 0xFF00) >> 8;
   b2 = w & 0x00FF;

   if (al_fputc(f, b1) == b1) {
      if (al_fputc(f, b2) == b2) {
         return 2;
      }
      return 1;
   }
   return 0;
}